

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# op_helper.c
# Opt level: O0

target_ulong helper_mret_riscv64(CPURISCVState_conflict2 *env,target_ulong cpu_pc_deb)

{
  ulong uVar1;
  ulong uVar2;
  sbyte sVar3;
  int iVar4;
  ulong newpriv;
  ulong uVar5;
  uintptr_t unaff_retaddr;
  int local_74;
  int local_64;
  uint local_5c;
  int local_44;
  target_ulong prev_virt;
  target_ulong prev_priv;
  target_ulong mstatus;
  target_ulong retpc;
  target_ulong cpu_pc_deb_local;
  CPURISCVState_conflict2 *env_local;
  
  if (env->priv < 3) {
    riscv_raise_exception_riscv64(env,2,unaff_retaddr);
  }
  uVar1 = env->mepc;
  iVar4 = riscv_has_ext(env,4);
  if ((iVar4 == 0) && ((uVar1 & 3) != 0)) {
    riscv_raise_exception_riscv64(env,0,unaff_retaddr);
  }
  uVar2 = env->mstatus;
  newpriv = (uVar2 & 0x1800) >> 0xb;
  uVar5 = (env->mstatus & 0x8000000000) >> 0x27;
  sVar3 = (sbyte)newpriv;
  if (env->priv_ver < 0x11000) {
    local_44 = 1 << sVar3;
  }
  else {
    local_44 = 8;
  }
  if (env->priv_ver < 0x11000) {
    local_5c = 1 << sVar3;
  }
  else {
    local_5c = 8;
  }
  if (env->priv_ver < 0x11000) {
    local_64 = 1 << sVar3;
  }
  else {
    local_64 = 8;
  }
  if (env->priv_ver < 0x11000) {
    local_74 = 1 << sVar3;
  }
  else {
    local_74 = 8;
  }
  env->mstatus = (uVar2 & ((long)local_44 ^ 0xffffffffffffffffU) |
                 ((uVar2 & 0x80) >> 7) * (long)(int)(local_5c & (local_64 << 1 ^ 0xffffffffU)) &
                 (long)local_74) & 0xffffff7fffffe77f | 0x80;
  riscv_cpu_set_mode_riscv64((CPURISCVState_conflict1 *)env,newpriv);
  iVar4 = riscv_has_ext(env,0x80);
  if (iVar4 != 0) {
    if (uVar5 != 0) {
      riscv_cpu_swap_hypervisor_regs_riscv64((CPURISCVState_conflict1 *)env);
    }
    riscv_cpu_set_virt_enabled_riscv64((CPURISCVState_conflict1 *)env,uVar5 != 0);
  }
  return uVar1;
}

Assistant:

target_ulong helper_mret(CPURISCVState *env, target_ulong cpu_pc_deb)
{
    if (!(env->priv >= PRV_M)) {
        riscv_raise_exception(env, RISCV_EXCP_ILLEGAL_INST, GETPC());
    }

    target_ulong retpc = env->mepc;
    if (!riscv_has_ext(env, RVC) && (retpc & 0x3)) {
        riscv_raise_exception(env, RISCV_EXCP_INST_ADDR_MIS, GETPC());
    }

    target_ulong mstatus = env->mstatus;
    target_ulong prev_priv = get_field(mstatus, MSTATUS_MPP);
    target_ulong prev_virt = MSTATUS_MPV_ISSET(env);
    mstatus = set_field(mstatus,
        env->priv_ver >= PRIV_VERSION_1_10_0 ?
        MSTATUS_MIE : MSTATUS_UIE << prev_priv,
        get_field(mstatus, MSTATUS_MPIE));
    mstatus = set_field(mstatus, MSTATUS_MPIE, 1);
    mstatus = set_field(mstatus, MSTATUS_MPP, PRV_U);
#ifdef TARGET_RISCV32
    env->mstatush = set_field(env->mstatush, MSTATUS_MPV, 0);
#else
    mstatus = set_field(mstatus, MSTATUS_MPV, 0);
#endif
    env->mstatus = mstatus;
    riscv_cpu_set_mode(env, prev_priv);

    if (riscv_has_ext(env, RVH)) {
        if (prev_virt) {
            riscv_cpu_swap_hypervisor_regs(env);
        }

        riscv_cpu_set_virt_enabled(env, prev_virt);
    }

    return retpc;
}